

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

uint64_t bitstream_get_bits(bitstream_t *bs,uint num_bits)

{
  uint uVar1;
  byte bVar2;
  uint64_t ret;
  uint start_bits;
  uint skip_bits;
  uint8_t *p;
  uint num_bits_local;
  bitstream_t *bs_local;
  ulong local_8;
  
  p = (bs->buffer).w + (bs->position >> 3);
  uVar1 = 8 - ((uint)bs->position & 7);
  bs->position = (ulong)num_bits + bs->position;
  ret = (uint64_t)(int)((uint)*p & (1 << ((byte)uVar1 & 0x1f)) - 1U);
  if (uVar1 < num_bits) {
    for (num_bits_local = num_bits - uVar1; p = p + 1, 7 < num_bits_local;
        num_bits_local = num_bits_local - 8) {
      ret = ret << 8 | (ulong)*p;
    }
    if (num_bits_local != 0) {
      bVar2 = (byte)num_bits_local;
      ret = ret << (bVar2 & 0x3f) |
            (long)(int)((int)(uint)*p >> (8 - bVar2 & 0x1f) & (1 << (bVar2 & 0x1f)) - 1U);
    }
    local_8 = ret;
  }
  else {
    local_8 = ret >> ((byte)uVar1 - (char)num_bits & 0x3f);
  }
  return local_8;
}

Assistant:

static inline uint64_t bitstream_get_bits(bitstream_t* bs, unsigned int num_bits) {
  ASSUME(1 <= num_bits && num_bits <= 64);

  const uint8_t* p              = &bs->buffer.r[bs->position / 8];
  const unsigned int skip_bits  = bs->position % 8;
  const unsigned int start_bits = 8 - skip_bits;

  bs->position += num_bits;
  uint64_t ret = (*p++ & ((1 << start_bits) - 1));

  if (num_bits <= start_bits) {
    return ret >> (start_bits - num_bits);
  }

  num_bits -= start_bits;
  for (; num_bits >= 8; num_bits -= 8, ++p) {
    ret = ret << 8 | *p;
  }

  if (num_bits > 0) {
    ret = ret << num_bits | ((*p >> (8 - num_bits)) & ((1 << num_bits) - 1));
  }

  return ret;
}